

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug * __thiscall QDebug::operator<<(QDebug *this,QString *t)

{
  char16_t *pcVar1;
  
  pcVar1 = (t->d).ptr;
  if (pcVar1 == (char16_t *)0x0) {
    pcVar1 = (char16_t *)&QString::_empty;
  }
  QDebug::putString((QChar *)this,(ulong)pcVar1);
  if (((QTextStream *)this->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)this->stream,' ');
  }
  return this;
}

Assistant:

inline QDebug &operator<<(const QString & t) { putString(t.constData(), size_t(t.size())); return maybeSpace(); }